

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::NodeLoader::begin__instance_geometry
          (NodeLoader *this,instance_geometry__AttributeData *attributeData)

{
  ClassId CVar1;
  reference ppNVar2;
  UniqueId *pUVar3;
  GeometryMaterialIdInfo *pGVar4;
  InstanceGeometryPointerArray *this_00;
  HelperLoaderBase *in_RDI;
  bool in_stack_0000004b;
  ClassId in_stack_0000004c;
  URI *in_stack_00000050;
  IFilePartLoader *in_stack_00000058;
  InstanceGeometry *instanceGeometry;
  UniqueId uniqueId;
  UniqueId instantiatedGeometryUniqueId;
  Node *currentNode;
  String *in_stack_ffffffffffffff38;
  InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)437> *in_stack_ffffffffffffff40;
  IFilePartLoader *in_stack_ffffffffffffff48;
  UniqueId *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff60;
  UniqueId local_60;
  UniqueId local_38;
  value_type local_18;
  
  ppNVar2 = std::
            stack<COLLADAFW::Node_*,_std::deque<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>_>
            ::top((stack<COLLADAFW::Node_*,_std::deque<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>_>
                   *)0xc42e3d);
  local_18 = *ppNVar2;
  HelperLoaderBase::getHandlingFilePartLoader(in_RDI);
  COLLADAFW::ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)359>::ID();
  pUVar3 = IFilePartLoader::createUniqueIdFromUrl
                     (in_stack_00000058,in_stack_00000050,in_stack_0000004c,in_stack_0000004b);
  local_38.mFileId = pUVar3->mFileId;
  local_38.mClassId = pUVar3->mClassId;
  local_38._4_4_ = *(undefined4 *)&pUVar3->field_0x4;
  local_38.mObjectId = pUVar3->mObjectId;
  HelperLoaderBase::getHandlingFilePartLoader(in_RDI);
  pGVar4 = IFilePartLoader::getMeshMaterialIdInfo((IFilePartLoader *)0xc42eb2);
  in_RDI[0xf]._vptr_HelperLoaderBase = (_func_int **)pGVar4;
  HelperLoaderBase::getHandlingFilePartLoader(in_RDI);
  CVar1 = COLLADAFW::ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)437>::ID();
  IFilePartLoader::createUniqueId
            (in_stack_ffffffffffffff48,(ClassId)((ulong)in_stack_ffffffffffffff40 >> 0x20));
  pUVar3 = (UniqueId *)operator_new(0x98);
  COLLADAFW::InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>::InstanceBindingBase
            ((InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)437> *)
             CONCAT44(CVar1,in_stack_ffffffffffffff60),pUVar3,in_stack_ffffffffffffff50);
  in_RDI[6]._vptr_HelperLoaderBase = (_func_int **)pUVar3;
  COLLADAFW::Node::getName_abi_cxx11_(local_18);
  COLLADAFW::InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>::setName
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  this_00 = COLLADAFW::Node::getInstanceGeometries(local_18);
  COLLADAFW::
  ArrayPrimitiveType<COLLADAFW::InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>_*>::
  append((ArrayPrimitiveType<COLLADAFW::InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>_*>
          *)this_00,
         (InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)437> **)in_stack_ffffffffffffff38);
  COLLADAFW::UniqueId::~UniqueId(&local_60);
  COLLADAFW::UniqueId::~UniqueId(&local_38);
  return true;
}

Assistant:

bool NodeLoader::begin__instance_geometry( const instance_geometry__AttributeData& attributeData )
	{
		COLLADAFW::Node* currentNode = mNodeStack.top();

		COLLADAFW::UniqueId instantiatedGeometryUniqueId = getHandlingFilePartLoader()->createUniqueIdFromUrl( attributeData.url, COLLADAFW::Geometry::ID());
		mCurrentMaterialInfo = &getHandlingFilePartLoader()->getMeshMaterialIdInfo();

        COLLADAFW::UniqueId uniqueId = getHandlingFilePartLoader()->createUniqueId ( COLLADAFW::InstanceGeometry::ID() );
		COLLADAFW::InstanceGeometry* instanceGeometry = FW_NEW COLLADAFW::InstanceGeometry ( uniqueId, instantiatedGeometryUniqueId );
		mCurrentInstanceGeometry = instanceGeometry;
		instanceGeometry->setName(currentNode->getName());
		currentNode->getInstanceGeometries().append(instanceGeometry);

		return true;
	}